

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void __thiscall xLearn::Metric::Initialize(Metric *this,ThreadPool *pool)

{
  ostream *poVar1;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if (pool != (ThreadPool *)0x0) {
    this->pool_ = pool;
    this->threadNumber_ =
         (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_start >> 3;
    return;
  }
  local_4c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
             ,&local_4d);
  std::__cxx11::string::string((string *)&local_48,"Initialize",&local_4e);
  poVar1 = Logger::Start(ERR,&local_28,0x3f,&local_48);
  poVar1 = std::operator<<(poVar1,"CHECK failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3f);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"pool");
  std::operator<<(poVar1," == NULL \n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  Logger::~Logger(&local_4c);
  abort();
}

Assistant:

void Initialize(ThreadPool* pool) {
    CHECK_NOTNULL(pool);
    pool_ = pool;
    threadNumber_ = pool_->ThreadNumber();
  }